

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverters.cpp
# Opt level: O1

Option<Kernel::TermList>
Kernel::Rebalancing::Inverters::tryInvertLinMul<Kernel::NumTraits<Kernel::RealConstantType>>
          (char *ctxt)

{
  anon_class_16_2_d7009eb6 func;
  MaybeUninit<Kernel::TermList> extraout_RDX;
  InversionContext *unaff_RBX;
  Option<Kernel::TermList> OVar1;
  char local_28;
  char in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  NumTraits<Kernel::RealConstantType> *in_stack_ffffffffffffffe8;
  
  func.ctxt = unaff_RBX;
  func.n = in_stack_ffffffffffffffe8;
  NumTraits<Kernel::RealConstantType>::
  ifLinMul<Kernel::Rebalancing::Inverters::tryInvertLinMul<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Rebalancing::InversionContext_const&,Kernel::NumTraits<Kernel::RealConstantType>)::_lambda(auto:1&,auto:2)_1_>
            ((Term *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),func);
  if (local_28 == '\x01') {
    *ctxt = in_stack_ffffffffffffffe0;
    if (in_stack_ffffffffffffffe0 == '\x01') {
      *(NumTraits<Kernel::RealConstantType> **)(ctxt + 8) = in_stack_ffffffffffffffe8;
    }
  }
  else {
    ctxt[0] = '\0';
    ctxt[1] = '\0';
    ctxt[2] = '\0';
    ctxt[3] = '\0';
    ctxt[4] = '\0';
    ctxt[5] = '\0';
    ctxt[6] = '\0';
    ctxt[7] = '\0';
    ctxt[8] = '\0';
    ctxt[9] = '\0';
    ctxt[10] = '\0';
    ctxt[0xb] = '\0';
    ctxt[0xc] = '\0';
    ctxt[0xd] = '\0';
    ctxt[0xe] = '\0';
    ctxt[0xf] = '\0';
  }
  OVar1.super_OptionBase<Kernel::TermList>._elem._elem = extraout_RDX._elem;
  OVar1.super_OptionBase<Kernel::TermList>._0_8_ = ctxt;
  return (Option<Kernel::TermList>)OVar1.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<TermList> tryInvertLinMul(InversionContext const& ctxt, NumTraits n) {
    return asig(n)
      .ifLinMul(&ctxt.topTerm(), [&](auto& c, auto t) { 
          return someIf(c != 0, [&]() { return asig(n).linMul(1/c, ctxt.toWrap()); }); 
      })
      .flatten();
}